

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

void __thiscall
QMetaPropertyBuilder::setNotifySignal(QMetaPropertyBuilder *this,QMetaMethodBuilder *value)

{
  QMetaPropertyBuilderPrivate *pQVar1;
  
  pQVar1 = d_func(this);
  if (pQVar1 != (QMetaPropertyBuilderPrivate *)0x0) {
    pQVar1->notifySignal = -(uint)(value->_mobj == (QMetaObjectBuilder *)0x0) | value->_index;
  }
  return;
}

Assistant:

void QMetaPropertyBuilder::setNotifySignal(const QMetaMethodBuilder &value)
{
    QMetaPropertyBuilderPrivate *d = d_func();
    if (d) {
        if (value._mobj) {
            d->notifySignal = value._index;
        } else {
            d->notifySignal = -1;
        }
    }
}